

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuVfsAccess(sqlite3_vfs *pVfs,char *zPath,int flags,int *pResOut)

{
  sqlite_int64 local_50;
  sqlite3_int64 sz;
  rbu_file *pDb;
  long lStack_38;
  int rc;
  sqlite3_vfs *pRealVfs;
  rbu_vfs *pRbuVfs;
  int *pResOut_local;
  char *pcStack_18;
  int flags_local;
  char *zPath_local;
  sqlite3_vfs *pVfs_local;
  
  lStack_38 = *(long *)(pVfs + 1);
  pRealVfs = pVfs;
  pRbuVfs = (rbu_vfs *)pResOut;
  pResOut_local._4_4_ = flags;
  pcStack_18 = zPath;
  zPath_local = (char *)pVfs;
  pDb._4_4_ = (**(code **)(lStack_38 + 0x38))(lStack_38,zPath,flags,pResOut);
  if ((((pDb._4_4_ == 0) && (pResOut_local._4_4_ == 0)) &&
      (sz = (sqlite3_int64)rbuFindMaindb((rbu_vfs *)pRealVfs,pcStack_18,1),
      (rbu_file *)sz != (rbu_file *)0x0)) &&
     ((((rbu_file *)sz)->pRbu != (sqlite3rbu *)0x0 && (((rbu_file *)sz)->pRbu->eStage == 1)))) {
    if ((pRbuVfs->base).iVersion == 0) {
      local_50 = 0;
      pDb._4_4_ = rbuVfsFileSize((sqlite3_file *)sz,&local_50);
      (pRbuVfs->base).iVersion = (uint)(0 < local_50);
    }
    else {
      pDb._4_4_ = 0xe;
    }
  }
  return pDb._4_4_;
}

Assistant:

static int rbuVfsAccess(
  sqlite3_vfs *pVfs, 
  const char *zPath, 
  int flags, 
  int *pResOut
){
  rbu_vfs *pRbuVfs = (rbu_vfs*)pVfs;
  sqlite3_vfs *pRealVfs = pRbuVfs->pRealVfs;
  int rc;

  rc = pRealVfs->xAccess(pRealVfs, zPath, flags, pResOut);

  /* If this call is to check if a *-wal file associated with an RBU target
  ** database connection exists, and the RBU update is in RBU_STAGE_OAL,
  ** the following special handling is activated:
  **
  **   a) if the *-wal file does exist, return SQLITE_CANTOPEN. This
  **      ensures that the RBU extension never tries to update a database
  **      in wal mode, even if the first page of the database file has
  **      been damaged. 
  **
  **   b) if the *-wal file does not exist, claim that it does anyway,
  **      causing SQLite to call xOpen() to open it. This call will also
  **      be intercepted (see the rbuVfsOpen() function) and the *-oal
  **      file opened instead.
  */
  if( rc==SQLITE_OK && flags==SQLITE_ACCESS_EXISTS ){
    rbu_file *pDb = rbuFindMaindb(pRbuVfs, zPath, 1);
    if( pDb && pDb->pRbu && pDb->pRbu->eStage==RBU_STAGE_OAL ){
      if( *pResOut ){
        rc = SQLITE_CANTOPEN;
      }else{
        sqlite3_int64 sz = 0;
        rc = rbuVfsFileSize(&pDb->base, &sz);
        *pResOut = (sz>0);
      }
    }
  }

  return rc;
}